

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall
iu_UtilTest_x_iutest_x_FindParamTypedTest_Test::Body
          (iu_UtilTest_x_iutest_x_FindParamTypedTest_Test *this)

{
  int iVar1;
  UnitTest *pUVar2;
  char *pcVar3;
  TestSuite *pTVar4;
  uint uVar5;
  ulong uVar6;
  AssertionResult iutest_ar;
  TestSuite *in_stack_fffffffffffffde8;
  _Alloc_hider in_stack_fffffffffffffdf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  bool local_1f0;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [392];
  
  pUVar2 = iutest::UnitTest::instance();
  uVar5 = (uint)((ulong)((long)(pUVar2->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar2->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      pUVar2 = iutest::UnitTest::instance();
      pcVar3 = strchr(((pUVar2->super_UnitTestImpl).m_testsuites.
                       super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6]->m_testsuite_name).
                      _M_dataplus._M_p,0x2f);
      if (((pcVar3 != (char *)0x0) && (iVar1 = strncmp(pcVar3 + 1,"UnitTest",8), iVar1 == 0)) &&
         (pcVar3[9] == '/')) break;
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffde8);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x7e;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  pUVar2 = iutest::UnitTest::instance();
  uVar5 = (uint)((ulong)((long)(pUVar2->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar2->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar5) {
    uVar6 = 0;
    do {
      pUVar2 = iutest::UnitTest::instance();
      pTVar4 = (pUVar2->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar6];
      pcVar3 = strchr((pTVar4->m_testsuite_name)._M_dataplus._M_p,0x2f);
      if (((pcVar3 != (char *)0x0) && (iVar1 = strncmp(pcVar3 + 1,"TypeParamTest",0xd), iVar1 == 0))
         && (pcVar3[0xe] == '/')) goto LAB_00133d0f;
      uVar6 = uVar6 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar6);
  }
  pTVar4 = (TestSuite *)0x0;
LAB_00133d0f:
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            ((AssertionResult *)&stack0xfffffffffffffdf0,"(find_testsuite)",pTVar4);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x82;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  pTVar4 = iuutil::FindParamTypedTestSuite("TypeParamTest",pTVar4);
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            ((AssertionResult *)&stack0xfffffffffffffdf0,"(find_testsuite)",pTVar4);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x84;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  iuutil::FindParamTypedTestSuite("TypeParamTest",pTVar4);
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffde8);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x86;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_P(ParamTest, Test)
{
}